

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_message.cc
# Opt level: O3

void __thiscall
google::protobuf::DynamicMessageFactory::~DynamicMessageFactory(DynamicMessageFactory *this)

{
  TypeInfo *this_00;
  void *in_RDX;
  void *extraout_RDX;
  uint32 *in_RSI;
  _Hash_node_base *p_Var1;
  
  (this->super_MessageFactory)._vptr_MessageFactory =
       (_func_int **)&PTR__DynamicMessageFactory_003baa80;
  for (p_Var1 = ((__node_base *)
                ((long)&(((this->prototypes_)._M_t.
                          super___uniq_ptr_impl<google::protobuf::DynamicMessageFactory::PrototypeMap,_std::default_delete<google::protobuf::DynamicMessageFactory::PrototypeMap>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_google::protobuf::DynamicMessageFactory::PrototypeMap_*,_std::default_delete<google::protobuf::DynamicMessageFactory::PrototypeMap>_>
                          .
                          super__Head_base<0UL,_google::protobuf::DynamicMessageFactory::PrototypeMap_*,_false>
                         ._M_head_impl)->map_)._M_h + 0x10))->_M_nxt;
      p_Var1 != (_Hash_node_base *)0x0; p_Var1 = p_Var1->_M_nxt) {
    DeleteDefaultOneofInstance((Descriptor *)p_Var1[2]._M_nxt[4]._M_nxt,in_RSI,in_RDX);
    this_00 = (TypeInfo *)p_Var1[2]._M_nxt;
    if (this_00 != (TypeInfo *)0x0) {
      DynamicMessage::TypeInfo::~TypeInfo(this_00);
    }
    operator_delete(this_00);
    in_RDX = extraout_RDX;
  }
  std::
  unique_ptr<google::protobuf::DynamicMessageFactory::PrototypeMap,_std::default_delete<google::protobuf::DynamicMessageFactory::PrototypeMap>_>
  ::~unique_ptr(&this->prototypes_);
  MessageFactory::~MessageFactory(&this->super_MessageFactory);
  return;
}

Assistant:

DynamicMessageFactory::~DynamicMessageFactory() {
  for (PrototypeMap::Map::iterator iter = prototypes_->map_.begin();
       iter != prototypes_->map_.end(); ++iter) {
    DeleteDefaultOneofInstance(iter->second->type, iter->second->offsets.get(),
                               iter->second->prototype);
    delete iter->second;
  }
}